

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32_t res)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  
  uVar3 = (ulong)res;
  pVar5.first = (byte *)(p + 1);
  lVar4 = -0x1c;
  do {
    if (lVar4 == 0) {
      lVar4 = 0;
      do {
        lVar2 = lVar4;
        if (lVar2 == 5) {
          return (pair<const_char_*,_unsigned_int>)ZEXT816(0);
        }
        lVar4 = lVar2 + 1;
      } while (p[lVar2 + 5] < '\0');
      pVar6.first = p + lVar2 + 6;
      pVar6._8_8_ = uVar3;
      return pVar6;
    }
    bVar1 = *pVar5.first;
    pVar5.second = (int)uVar3 + (bVar1 - 1 << ((char)lVar4 + 0x23U & 0x1f));
    uVar3 = (ulong)pVar5.second;
    pVar5.first = pVar5.first + 1;
    lVar4 = lVar4 + 7;
  } while ((char)bVar1 < '\0');
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

std::pair<const char*, uint32_t> VarintParseSlow32(const char* p,
                                                   uint32_t res) {
  for (std::uint32_t i = 1; i < 5; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}